

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

bool BailOutInfo::IsBailOutHelper(JnHelperMethod helper)

{
  bool local_9;
  JnHelperMethod helper_local;
  
  local_9 = helper == HelperSaveAllRegistersAndBailOut ||
            helper == HelperSaveAllRegistersAndBranchBailOut;
  return local_9;
}

Assistant:

bool
BailOutInfo::IsBailOutHelper(IR::JnHelperMethod helper)
{
    switch (helper)
    {
    case IR::HelperSaveAllRegistersAndBailOut:
    case IR::HelperSaveAllRegistersAndBranchBailOut:
#ifdef _M_IX86
    case IR::HelperSaveAllRegistersNoSse2AndBailOut:
    case IR::HelperSaveAllRegistersNoSse2AndBranchBailOut:
#endif
        return true;
    };

    return false;
}